

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::PausableReadAsyncIoStream::PausableRead::PausableRead
          (PausableRead *this,PromiseFulfiller<unsigned_long> *fulfiller,
          PausableReadAsyncIoStream *parent,void *buffer,size_t minBytes,size_t maxBytes)

{
  SourceLocation location;
  bool bVar1;
  Fault local_b8;
  Fault f;
  undefined1 local_a8 [8];
  DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
  _kjCondition;
  SourceLocation local_68;
  PausableReadAsyncIoStream *local_50;
  Type local_48;
  undefined1 local_40 [16];
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  PausableReadAsyncIoStream *parent_local;
  PromiseFulfiller<unsigned_long> *fulfiller_local;
  PausableRead *this_local;
  
  this->fulfiller = fulfiller;
  this->parent = parent;
  this->operationBuffer = buffer;
  this->operationMinBytes = minBytes;
  this->operationMaxBytes = maxBytes;
  local_40._8_8_ = maxBytes;
  maxBytes_local = minBytes;
  minBytes_local = (size_t)buffer;
  buffer_local = parent;
  parent_local = (PausableReadAsyncIoStream *)fulfiller;
  fulfiller_local = (PromiseFulfiller<unsigned_long> *)this;
  tryReadImpl((PausableReadAsyncIoStream *)local_40,parent,(size_t)this->operationBuffer,
              this->operationMinBytes);
  local_48.fulfiller = (PromiseFulfiller<unsigned_long> *)parent_local;
  local_50 = parent_local;
  SourceLocation::SourceLocation
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"PausableRead",0x16a4,0x13);
  location.function = local_68.function;
  location.fileName = local_68.fileName;
  location.lineNumber = local_68.lineNumber;
  location.columnNumber = local_68.columnNumber;
  Promise<unsigned_long>::
  then<kj::PausableReadAsyncIoStream::PausableRead::PausableRead(kj::PromiseFulfiller<unsigned_long>&,kj::PausableReadAsyncIoStream&,void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::PausableReadAsyncIoStream::PausableRead::PromiseFulfiller(kj::PromiseFulfiller<unsigned_long>&,kj::PausableReadAsyncIoStream&,void*,unsigned_long,unsigned_long)::_lambda(kj::Exception&&)_1_>
            ((Promise<unsigned_long> *)&this->innerRead,(Type *)local_40,&local_48,location);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_40);
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::PausableReadAsyncIoStream::PausableRead_&> *)
                           ((long)buffer_local + 0x20));
  kj::_::DebugExpression<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead&>&>::operator==
            ((DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
              *)local_a8,
             (DebugExpression<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead&>&> *)&f,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead&>&,kj::None_const&>&>
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x16ab,FAILED,"parent.maybePausableRead == kj::none","_kjCondition,",
               (DebugComparison<kj::Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>_&,_const_kj::None_&>
                *)local_a8);
    kj::_::Debug::Fault::fatal(&local_b8);
  }
  Maybe<kj::PausableReadAsyncIoStream::PausableRead_&>::operator=
            ((Maybe<kj::PausableReadAsyncIoStream::PausableRead_&> *)((long)buffer_local + 0x20),
             this);
  return;
}

Assistant:

PausableRead(
      kj::PromiseFulfiller<size_t>& fulfiller, PausableReadAsyncIoStream& parent,
      void* buffer, size_t minBytes, size_t maxBytes)
      : fulfiller(fulfiller), parent(parent),
        operationBuffer(buffer), operationMinBytes(minBytes), operationMaxBytes(maxBytes),
        innerRead(parent.tryReadImpl(operationBuffer, operationMinBytes, operationMaxBytes).then(
            [&fulfiller](size_t size) mutable -> kj::Promise<void> {
          fulfiller.fulfill(kj::mv(size));
          return kj::READY_NOW;
        }, [&fulfiller](kj::Exception&& err) {
          fulfiller.reject(kj::mv(err));
        })) {
    KJ_ASSERT(parent.maybePausableRead == kj::none);
    parent.maybePausableRead = *this;
  }